

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_data_dictionary_add_product_class(coda_product_class *product_class)

{
  char *__s1;
  coda_product_class *pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  void *pvVar6;
  coda_product_class *temp;
  coda_product_class **new_product_class;
  coda_product_class *pcStack_18;
  int i;
  coda_product_class *product_class_local;
  
  plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
  if (*plVar4 == 0) {
    coda_set_error(-400,"coda has not been initialized");
    product_class_local._4_4_ = -1;
  }
  else {
    plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
    iVar3 = coda_hashtable_add_name(*(hashtable **)(*plVar4 + 0x10),product_class->name);
    if (iVar3 == 0) {
      puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
      if (*(int *)*puVar5 % 0x10 == 0) {
        plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
        pvVar6 = *(void **)(*plVar4 + 8);
        puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
        pvVar6 = realloc(pvVar6,(long)(*(int *)*puVar5 + 0x10) << 3);
        if (pvVar6 == (void *)0x0) {
          puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         (long)(*(int *)*puVar5 + 0x10) << 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                         ,0x3e2);
          return -1;
        }
        plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
        *(void **)(*plVar4 + 8) = pvVar6;
      }
      pcStack_18 = product_class;
      for (new_product_class._4_4_ = 0; puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50),
          new_product_class._4_4_ < *(int *)*puVar5;
          new_product_class._4_4_ = new_product_class._4_4_ + 1) {
        __s1 = pcStack_18->name;
        plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
        iVar3 = strcmp(__s1,(char *)**(undefined8 **)
                                      (*(long *)(*plVar4 + 8) + (long)new_product_class._4_4_ * 8));
        if (iVar3 < 0) {
          plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
          pcVar1 = *(coda_product_class **)
                    (*(long *)(*plVar4 + 8) + (long)new_product_class._4_4_ * 8);
          plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
          *(coda_product_class **)(*(long *)(*plVar4 + 8) + (long)new_product_class._4_4_ * 8) =
               pcStack_18;
          pcStack_18 = pcVar1;
        }
      }
      puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
      *(int *)*puVar5 = *(int *)*puVar5 + 1;
      plVar4 = (long *)__tls_get_addr(&PTR_00246f50);
      lVar2 = *(long *)(*plVar4 + 8);
      puVar5 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
      *(coda_product_class **)(lVar2 + (long)(*(int *)*puVar5 + -1) * 8) = pcStack_18;
      iVar3 = data_dictionary_rebuild_product_class_hash_data();
      if (iVar3 == 0) {
        product_class_local._4_4_ = 0;
      }
      else {
        product_class_local._4_4_ = -1;
      }
    }
    else {
      coda_set_error(-400,"duplicate product class %s",product_class->name);
      product_class_local._4_4_ = -1;
    }
  }
  return product_class_local._4_4_;
}

Assistant:

int coda_data_dictionary_add_product_class(coda_product_class *product_class)
{
    int i;

    if (coda_global_data_dictionary == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "coda has not been initialized");
        return -1;
    }

    if (hashtable_add_name(coda_global_data_dictionary->hash_data, product_class->name) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "duplicate product class %s", product_class->name);
        return -1;
    }
    if (coda_global_data_dictionary->num_product_classes % BLOCK_SIZE == 0)
    {
        coda_product_class **new_product_class;

        new_product_class = realloc(coda_global_data_dictionary->product_class,
                                    (coda_global_data_dictionary->num_product_classes + BLOCK_SIZE) *
                                    sizeof(coda_product_class *));
        if (new_product_class == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (coda_global_data_dictionary->num_product_classes + BLOCK_SIZE) *
                           sizeof(coda_product_class *), __FILE__, __LINE__);
            return -1;
        }
        coda_global_data_dictionary->product_class = new_product_class;
    }
    /* add sorted */
    for (i = 0; i < coda_global_data_dictionary->num_product_classes; i++)
    {
        if (strcmp(product_class->name, coda_global_data_dictionary->product_class[i]->name) < 0)
        {
            coda_product_class *temp = product_class;

            product_class = coda_global_data_dictionary->product_class[i];
            coda_global_data_dictionary->product_class[i] = temp;
        }
    }
    coda_global_data_dictionary->num_product_classes++;
    coda_global_data_dictionary->product_class[coda_global_data_dictionary->num_product_classes - 1] = product_class;

    /* rebuild hashtable (since we use a sorted insert) */
    if (data_dictionary_rebuild_product_class_hash_data() != 0)
    {
        return -1;
    }

    return 0;
}